

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

void Abc_FlowRetime_UpdateLags(void)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  int *__s;
  Vec_Ptr_t *pVVar5;
  MinRegMan_t *pMVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  pMVar6 = pManMR;
  pAVar3 = pManMR->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar9 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar9) {
      __s = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar9;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar2) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar9;
  }
  iVar2 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar2 + 1;
  if (0x3ffffffe < iVar2) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar5 = pAVar3->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      plVar4 = (long *)pVVar5->pArray[lVar8];
      if ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 8) {
        if (pMVar6->fIsForward == 0) {
          if (0 < *(int *)((long)plVar4 + 0x2c)) {
            lVar7 = 0;
            do {
              Abc_FlowRetime_UpdateLags_back_rec
                        (*(Abc_Obj_t **)
                          (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                          (long)*(int *)(plVar4[6] + lVar7 * 4) * 8));
              lVar7 = lVar7 + 1;
            } while (lVar7 < *(int *)((long)plVar4 + 0x2c));
          }
        }
        else if (0 < *(int *)((long)plVar4 + 0x1c)) {
          lVar7 = 0;
          do {
            Abc_FlowRetime_UpdateLags_forw_rec
                      (*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                        (long)*(int *)(plVar4[4] + lVar7 * 4) * 8));
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)plVar4 + 0x1c));
        }
      }
      lVar8 = lVar8 + 1;
      pVVar5 = pManMR->pNtk->vBoxes;
      pMVar6 = pManMR;
    } while (lVar8 < pVVar5->nSize);
  }
  return;
}

Assistant:

void
Abc_FlowRetime_UpdateLags( ) {
  Abc_Obj_t *pObj, *pNext;
  int i, j;

  Abc_NtkIncrementTravId( pManMR->pNtk );

  Abc_NtkForEachLatch( pManMR->pNtk, pObj, i )
    if (pManMR->fIsForward) {
      Abc_ObjForEachFanin( pObj, pNext, j )          
        Abc_FlowRetime_UpdateLags_forw_rec( pNext );
    } else {
      Abc_ObjForEachFanout( pObj, pNext, j )          
        Abc_FlowRetime_UpdateLags_back_rec( pNext );
    }
}